

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall tcu::rotationMatrix(tcu *this,float radians)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Matrix<float,_2,_2> MVar5;
  float s;
  float c;
  float radians_local;
  Matrix<float,_2,_2> *mat;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  MVar5.m_data.m_data[0].m_data[0] = deFloatCos(radians);
  fVar2 = deFloatSin(radians);
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,0,0);
  *pfVar1 = MVar5.m_data.m_data[0].m_data[0];
  fVar3 = -0.0;
  fVar4 = -0.0;
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,0,1);
  *pfVar1 = -fVar2;
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,1,0);
  *pfVar1 = fVar2;
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,1,1);
  MVar5.m_data.m_data[0].m_data[1] = 0.0;
  *pfVar1 = MVar5.m_data.m_data[0].m_data[0];
  MVar5.m_data.m_data[1].m_data[1] = fVar4;
  MVar5.m_data.m_data[1].m_data[0] = fVar3;
  return (Matrix<float,_2,_2>)MVar5.m_data.m_data;
}

Assistant:

inline Matrix<float, 2, 2> rotationMatrix (float radians)
{
	Matrix<float, 2, 2> mat;
	float				c	= deFloatCos(radians);
	float				s	= deFloatSin(radians);

	mat(0, 0) = c;
	mat(0, 1) = -s;
	mat(1, 0) = s;
	mat(1, 1) = c;

	return mat;
}